

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void al_get_separate_blender(int *op,int *src,int *dst,int *alpha_op,int *alpha_src,int *alpha_dst)

{
  thread_local_state *ptVar1;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    if (op != (int *)0x0) {
      *op = (ptVar1->current_blender).blend_op;
    }
    if (src != (int *)0x0) {
      *src = (ptVar1->current_blender).blend_source;
    }
    if (dst != (int *)0x0) {
      *dst = (ptVar1->current_blender).blend_dest;
    }
    if (alpha_op != (int *)0x0) {
      *alpha_op = (ptVar1->current_blender).blend_alpha_op;
    }
    if (alpha_src != (int *)0x0) {
      *alpha_src = (ptVar1->current_blender).blend_alpha_source;
    }
    if (alpha_dst != (int *)0x0) {
      *alpha_dst = (ptVar1->current_blender).blend_alpha_dest;
    }
  }
  return;
}

Assistant:

void al_get_separate_blender(int *op, int *src, int *dst,
   int *alpha_op, int *alpha_src, int *alpha_dst)
{
   thread_local_state *tls;
   ALLEGRO_BLENDER *b;

   if ((tls = tls_get()) == NULL)
      return;

   b = &tls->current_blender;

   if (op)
      *op = b->blend_op;

   if (src)
      *src = b->blend_source;

   if (dst)
      *dst = b->blend_dest;

   if (alpha_op)
      *alpha_op = b->blend_alpha_op;

   if (alpha_src)
      *alpha_src = b->blend_alpha_source;

   if (alpha_dst)
      *alpha_dst = b->blend_alpha_dest;
}